

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

CopyStatus cmsys::SystemTools::CloneFileContent(string *source,string *destination)

{
  CopyStatus CVar1;
  int iVar2;
  char *pcVar3;
  Status s;
  CopyStatus local_5c;
  Status local_50;
  Status local_48;
  int local_40;
  Status SStack_3c;
  int out;
  Status local_34;
  uint local_2c;
  string *psStack_28;
  int in;
  string *destination_local;
  string *source_local;
  CopyStatus status;
  
  psStack_28 = destination;
  destination_local = source;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  local_2c = open(pcVar3,0);
  if ((int)local_2c < 0) {
    local_34 = Status::POSIX_errno();
    CopyStatus::CopyStatus((CopyStatus *)((long)&source_local + 4),local_34,SourcePath);
  }
  else {
    SStack_3c = RemoveFile(psStack_28);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    local_40 = open(pcVar3,0x241,0x180);
    if (local_40 < 0) {
      local_48 = Status::POSIX_errno();
      CopyStatus::CopyStatus((CopyStatus *)((long)&source_local + 4),local_48,DestPath);
      close(local_2c);
    }
    else {
      local_50 = Status::Success();
      CopyStatus::CopyStatus((CopyStatus *)((long)&source_local + 4),local_50,NoPath);
      iVar2 = ioctl(local_40,0x40049409,(ulong)local_2c);
      if (iVar2 < 0) {
        s = Status::POSIX_errno();
        CopyStatus::CopyStatus(&local_5c,s,NoPath);
        stack0xffffffffffffffec = local_5c.super_Status;
        status.super_Status.Kind_ = local_5c.Path;
      }
      close(local_2c);
      close(local_40);
    }
  }
  CVar1.Path = status.super_Status.Kind_;
  CVar1.super_Status = stack0xffffffffffffffec;
  return CVar1;
}

Assistant:

SystemTools::CopyStatus SystemTools::CloneFileContent(
  std::string const& source, std::string const& destination)
{
#if defined(__linux) && defined(FICLONE)
  int in = open(source.c_str(), O_RDONLY);
  if (in < 0) {
    return CopyStatus{ Status::POSIX_errno(), CopyStatus::SourcePath };
  }

  SystemTools::RemoveFile(destination);

  int out =
    open(destination.c_str(), O_WRONLY | O_CREAT | O_TRUNC, S_IRUSR | S_IWUSR);
  if (out < 0) {
    CopyStatus status{ Status::POSIX_errno(), CopyStatus::DestPath };
    close(in);
    return status;
  }

  CopyStatus status{ Status::Success(), CopyStatus::NoPath };
  if (ioctl(out, FICLONE, in) < 0) {
    status = CopyStatus{ Status::POSIX_errno(), CopyStatus::NoPath };
  }
  close(in);
  close(out);

  return status;
#elif defined(__APPLE__) &&                                                   \
  defined(KWSYS_SYSTEMTOOLS_HAVE_MACOS_COPYFILE_CLONE)
  // When running as root, copyfile() copies more metadata than we
  // want, such as ownership.  Pretend it is not available.
  if (getuid() == 0) {
    return CopyStatus{ Status::POSIX(ENOSYS), CopyStatus::NoPath };
  }

  // NOTE: we cannot use `clonefile` as the {a,c,m}time for the file needs to
  // be updated by `copy_file_if_different` and `copy_file`.
  if (copyfile(source.c_str(), destination.c_str(), nullptr,
               COPYFILE_METADATA | COPYFILE_CLONE) < 0) {
    return CopyStatus{ Status::POSIX_errno(), CopyStatus::NoPath };
  }
#  if KWSYS_CXX_HAS_UTIMENSAT
  // utimensat is only available on newer Unixes and macOS 10.13+
  if (utimensat(AT_FDCWD, destination.c_str(), nullptr, 0) < 0) {
    return CopyStatus{ Status::POSIX_errno(), CopyStatus::DestPath };
  }
#  else
  // fall back to utimes
  if (utimes(destination.c_str(), nullptr) < 0) {
    return CopyStatus{ Status::POSIX_errno(), CopyStatus::DestPath };
  }
#  endif
  return CopyStatus{ Status::Success(), CopyStatus::NoPath };
#else
  (void)source;
  (void)destination;
  return CopyStatus{ Status::POSIX(ENOSYS), CopyStatus::NoPath };
#endif
}